

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::SystemInformationImplementation::RunCPUCheck(SystemInformationImplementation *this)

{
  int *piVar1;
  double dVar2;
  pointer ppcVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  long lVar7;
  ulonglong uVar8;
  ulong uVar9;
  pointer ppcVar10;
  char *__nptr;
  uint uVar11;
  bool bVar12;
  float fVar13;
  string sStack_3b8;
  undefined1 *puStack_398;
  undefined8 uStack_390;
  undefined1 auStack_388 [16];
  string sStack_378;
  string sStack_358;
  string sStack_338;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> _Stack_318;
  string sStack_300;
  string sStack_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2c0;
  string sStack_2a0;
  string sStack_280;
  string sStack_260;
  string sStack_240;
  string sStack_220;
  string sStack_200;
  string sStack_1e0;
  string sStack_1c0;
  string sStack_1a0;
  string sStack_180;
  string sStack_160;
  string sStack_140;
  string sStack_120;
  string sStack_100;
  string sStack_e0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> _Stack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_90;
  string sStack_70;
  string sStack_50;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  puStack_398 = auStack_388;
  uStack_390 = 0;
  auStack_388[0] = 0;
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    std::operator<<((ostream *)&std::cerr,"Problem opening /proc/cpuinfo\n");
    goto LAB_0059d112;
  }
  uVar9 = 0;
  while (iVar4 = feof(__stream), iVar4 == 0) {
    fgetc(__stream);
    std::__cxx11::string::push_back((char)&puStack_398);
    uVar9 = uVar9 + 1;
  }
  fclose(__stream);
  if (uVar9 < 2) {
    std::operator<<((ostream *)&std::cerr,"No data in /proc/cpuinfo\n");
    goto LAB_0059d112;
  }
  std::__cxx11::string::resize((ulong)&puStack_398);
  while (lVar7 = std::__cxx11::string::find((char *)&puStack_398,0x7ecbda), lVar7 != -1) {
    this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
  }
  _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_c0._M_impl.super__Rb_tree_header._M_header;
  _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&sStack_e0,(string *)&puStack_398);
  ExtractValueFromCpuInfoFile(&sStack_2e0,this,&sStack_e0,"physical id",0);
  std::__cxx11::string::~string((string *)&sStack_e0);
  while (this->CurrentPositionInFile != 0xffffffffffffffff) {
    sStack_338._M_dataplus._M_p._0_4_ = atoi(sStack_2e0._M_dataplus._M_p);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &_Stack_c0,(int *)&sStack_338);
    std::__cxx11::string::string((string *)&sStack_50,(string *)&puStack_398);
    ExtractValueFromCpuInfoFile
              (&sStack_300,this,&sStack_50,"physical id",this->CurrentPositionInFile + 1);
    std::__cxx11::string::operator=((string *)&sStack_2e0,(string *)&sStack_300);
    std::__cxx11::string::~string((string *)&sStack_300);
    std::__cxx11::string::~string((string *)&sStack_50);
  }
  bVar12 = _Stack_c0._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar4 = (int)_Stack_c0._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::string((string *)&sStack_100,(string *)&puStack_398);
  ExtractValueFromCpuInfoFile(&sStack_300,this,&sStack_100,"cpu cores",0);
  std::__cxx11::string::~string((string *)&sStack_100);
  if (sStack_300._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_120,(string *)&puStack_398);
    ExtractValueFromCpuInfoFile(&sStack_338,this,&sStack_120,"ncpus probed",0);
    std::__cxx11::string::operator=((string *)&sStack_300,(string *)&sStack_338);
    std::__cxx11::string::~string((string *)&sStack_338);
    std::__cxx11::string::~string((string *)&sStack_120);
  }
  iVar5 = atoi(sStack_300._M_dataplus._M_p);
  iVar4 = (iVar4 + (uint)bVar12) * (iVar5 + (uint)(iVar5 == 0));
  uVar11 = iVar4 + (uint)(iVar4 == 0);
  this->NumberOfPhysicalCPU = uVar11;
  uVar6 = this->NumberOfLogicalCPU;
  if (this->NumberOfLogicalCPU == 0) {
    this->NumberOfLogicalCPU = uVar11;
    uVar6 = uVar11;
  }
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical = uVar6 / uVar11;
  std::__cxx11::string::string((string *)&sStack_140,(string *)&puStack_398);
  ExtractValueFromCpuInfoFile(&sStack_338,this,&sStack_140,"cpu MHz",0);
  std::__cxx11::string::~string((string *)&sStack_140);
  if (sStack_338._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_160,(string *)&puStack_398);
    ExtractValueFromCpuInfoFile(&sStack_358,this,&sStack_160,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&sStack_338,(string *)&sStack_358);
    std::__cxx11::string::~string((string *)&sStack_358);
    std::__cxx11::string::~string((string *)&sStack_160);
    if (sStack_338._M_string_length == 0) {
      std::__cxx11::string::string((string *)&sStack_180,(string *)&puStack_398);
      ExtractValueFromCpuInfoFile(&sStack_358,this,&sStack_180,"CPU0ClkTck",0);
      std::__cxx11::string::operator=((string *)&sStack_338,(string *)&sStack_358);
      std::__cxx11::string::~string((string *)&sStack_358);
      std::__cxx11::string::~string((string *)&sStack_180);
      __nptr = (char *)CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p);
      iVar4 = 10;
    }
    else {
      __nptr = (char *)CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p);
      iVar4 = 0x10;
    }
    uVar8 = strtoull(__nptr,(char **)0x0,iVar4);
    fVar13 = (float)uVar8 / 1e+06;
  }
  else {
    dVar2 = atof((char *)CONCAT44(sStack_338._M_dataplus._M_p._4_4_,(int)sStack_338._M_dataplus._M_p
                                 ));
    fVar13 = (float)dVar2;
  }
  this->CPUSpeedInMHz = fVar13;
  std::__cxx11::string::string((string *)&sStack_1a0,(string *)&puStack_398);
  ExtractValueFromCpuInfoFile(&sStack_358,this,&sStack_1a0,"cpu family",0);
  std::__cxx11::string::~string((string *)&sStack_1a0);
  if (sStack_358._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_1c0,(string *)&puStack_398);
    ExtractValueFromCpuInfoFile(&sStack_378,this,&sStack_1c0,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&sStack_358,(string *)&sStack_378);
    std::__cxx11::string::~string((string *)&sStack_378);
    std::__cxx11::string::~string((string *)&sStack_1c0);
  }
  iVar4 = atoi(sStack_358._M_dataplus._M_p);
  (this->ChipID).Family = iVar4;
  std::__cxx11::string::string((string *)&sStack_1e0,(string *)&puStack_398);
  ExtractValueFromCpuInfoFile(&sStack_378,this,&sStack_1e0,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&sStack_378);
  std::__cxx11::string::~string((string *)&sStack_378);
  std::__cxx11::string::~string((string *)&sStack_1e0);
  FindManufacturer(this,&sStack_358);
  if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
    bVar12 = std::operator==(&sStack_358,"PA-RISC 1.1a");
    iVar4 = 0x11a;
    if (!bVar12) {
      bVar12 = std::operator==(&sStack_358,"PA-RISC 2.0");
      iVar4 = 0x200;
      if (!bVar12) goto LAB_0059cbd1;
    }
    (this->ChipID).Family = iVar4;
  }
LAB_0059cbd1:
  std::__cxx11::string::string((string *)&sStack_200,(string *)&puStack_398);
  ExtractValueFromCpuInfoFile(&sStack_378,this,&sStack_200,"model",0);
  iVar4 = atoi(sStack_378._M_dataplus._M_p);
  (this->ChipID).Model = iVar4;
  std::__cxx11::string::~string((string *)&sStack_378);
  std::__cxx11::string::~string((string *)&sStack_200);
  bVar12 = RetrieveClassicalCPUIdentity(this);
  if (!bVar12) {
    std::__cxx11::string::string((string *)&sStack_220,(string *)&puStack_398);
    ExtractValueFromCpuInfoFile(&sStack_378,this,&sStack_220,"cpu",0);
    std::__cxx11::string::~string((string *)&sStack_220);
    if (sStack_378._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(this->ChipID).ProcessorName);
    }
    std::__cxx11::string::~string((string *)&sStack_378);
  }
  std::__cxx11::string::string((string *)&sStack_240,(string *)&puStack_398);
  ExtractValueFromCpuInfoFile(&sStack_378,this,&sStack_240,"stepping",0);
  std::__cxx11::string::~string((string *)&sStack_240);
  if (sStack_378._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_260,(string *)&puStack_398);
    ExtractValueFromCpuInfoFile(&sStack_3b8,this,&sStack_260,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&sStack_378,(string *)&sStack_3b8);
    std::__cxx11::string::~string((string *)&sStack_3b8);
    std::__cxx11::string::~string((string *)&sStack_260);
  }
  iVar4 = atoi(sStack_378._M_dataplus._M_p);
  (this->ChipID).Revision = iVar4;
  std::__cxx11::string::string((string *)&sStack_280,(string *)&puStack_398);
  ExtractValueFromCpuInfoFile(&sStack_3b8,this,&sStack_280,"model name",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).ModelName,(string *)&sStack_3b8);
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::__cxx11::string::~string((string *)&sStack_280);
  _Stack_318._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_318._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_318._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sStack_3b8._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&_Stack_318,(char **)&sStack_3b8);
  sStack_3b8._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&_Stack_318,(char **)&sStack_3b8);
  sStack_3b8._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&_Stack_318,(char **)&sStack_3b8);
  ppcVar3 = _Stack_318._M_impl.super__Vector_impl_data._M_finish;
  (this->Features).L1CacheSize = 0;
  for (ppcVar10 = _Stack_318._M_impl.super__Vector_impl_data._M_start; ppcVar10 != ppcVar3;
      ppcVar10 = ppcVar10 + 1) {
    std::__cxx11::string::string((string *)&sStack_70,(string *)&puStack_398);
    ExtractValueFromCpuInfoFile(&sStack_3b8,this,&sStack_70,*ppcVar10,0);
    std::__cxx11::string::~string((string *)&sStack_70);
    if (sStack_3b8._M_string_length != 0) {
      lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x824ccc);
      if (lVar7 != -1) {
        std::__cxx11::string::resize((ulong)&sStack_3b8);
      }
      iVar4 = atoi(sStack_3b8._M_dataplus._M_p);
      piVar1 = &(this->Features).L1CacheSize;
      *piVar1 = *piVar1 + iVar4;
    }
    std::__cxx11::string::~string((string *)&sStack_3b8);
  }
  std::__cxx11::string::string((string *)&sStack_2a0,(string *)&puStack_398);
  ExtractValueFromCpuInfoFile(&sStack_3b8,this,&sStack_2a0,"flags",0);
  std::__cxx11::string::~string((string *)&sStack_2a0);
  if (sStack_378._M_string_length != 0) {
    std::operator+(&bStack_2c0," ",&sStack_3b8);
    std::operator+(&bStack_90,&bStack_2c0," ");
    std::__cxx11::string::operator=((string *)&sStack_3b8,(string *)&bStack_90);
    std::__cxx11::string::~string((string *)&bStack_90);
    std::__cxx11::string::~string((string *)&bStack_2c0);
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7ecca5);
    if (lVar7 != -1) {
      (this->Features).HasFPU = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7eccab);
    if (lVar7 != -1) {
      (this->Features).HasTSC = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7eccb1);
    if (lVar7 != -1) {
      (this->Features).HasMMX = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7eccb7);
    if (lVar7 != -1) {
      (this->Features).HasSSE = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7eccbd);
    if (lVar7 != -1) {
      (this->Features).HasSSE2 = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7eccc4);
    if (lVar7 != -1) {
      (this->Features).HasAPIC = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7ecccb);
    if (lVar7 != -1) {
      (this->Features).HasCMOV = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7eccd2);
    if (lVar7 != -1) {
      (this->Features).HasMTRR = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7eccd9);
    if (lVar7 != -1) {
      (this->Features).HasACPI = true;
    }
    lVar7 = std::__cxx11::string::find((char *)&sStack_3b8,0x7ecce0);
    if (lVar7 != -1) {
      (this->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  std::__cxx11::string::~string((string *)&sStack_3b8);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&_Stack_318);
  std::__cxx11::string::~string((string *)&sStack_378);
  std::__cxx11::string::~string((string *)&sStack_358);
  std::__cxx11::string::~string((string *)&sStack_338);
  std::__cxx11::string::~string((string *)&sStack_300);
  std::__cxx11::string::~string((string *)&sStack_2e0);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&_Stack_c0);
LAB_0059d112:
  std::__cxx11::string::~string((string *)&puStack_398);
  return;
}

Assistant:

void SystemInformationImplementation::RunCPUCheck()
{
#ifdef _WIN32
  // Check to see if this processor supports CPUID.
  bool supportsCPUID = DoesCPUSupportCPUID();

  if (supportsCPUID) {
    // Retrieve the CPU details.
    RetrieveCPUIdentity();
    this->FindManufacturer();
    RetrieveCPUFeatures();
  }

  // These two may be called without support for the CPUID instruction.
  // (But if the instruction is there, they should be called *after*
  // the above call to RetrieveCPUIdentity... that's why the two if
  // blocks exist with the same "if (supportsCPUID)" logic...
  //
  if (!RetrieveCPUClockSpeed()) {
    RetrieveClassicalCPUClockSpeed();
  }

  if (supportsCPUID) {
    // Retrieve cache information.
    if (!RetrieveCPUCacheDetails()) {
      RetrieveClassicalCPUCacheDetails();
    }

    // Retrieve the extended CPU details.
    if (!RetrieveExtendedCPUIdentity()) {
      RetrieveClassicalCPUIdentity();
    }

    RetrieveExtendedCPUFeatures();
    RetrieveCPUPowerManagement();

    // Now attempt to retrieve the serial number (if possible).
    RetrieveProcessorSerialNumber();
  }

  this->CPUCountWindows();

#elif defined(__APPLE__)
  this->ParseSysCtl();
#elif defined(__SVR4) && defined(__sun)
  this->QuerySolarisProcessor();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXProcessor();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) ||  \
  defined(__DragonFly__)
  this->QueryBSDProcessor();
#elif defined(__hpux)
  this->QueryHPUXProcessor();
#elif defined(__linux) || defined(__CYGWIN__)
  this->RetrieveInformationFromCpuInfoFile();
#else
  this->QueryProcessor();
#endif
}